

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_soundex(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uchar uVar1;
  int iVar2;
  ushort **ppuVar3;
  bool bVar4;
  uchar local_41;
  int code;
  int iStack_3c;
  uchar prevcode;
  int j;
  int i;
  char zResult [8];
  uchar *zIn;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_string(pCtx,"",0);
  }
  else {
    zResult = (char  [8])jx9_value_to_string(*apArg,(int *)0x0);
    iStack_3c = 0;
    while( true ) {
      bVar4 = false;
      if ((*(char *)((long)zResult + (long)iStack_3c) != '\0') &&
         (bVar4 = false, *(byte *)((long)zResult + (long)iStack_3c) < 0xc0)) {
        ppuVar3 = __ctype_b_loc();
        bVar4 = ((*ppuVar3)[(int)(uint)*(byte *)((long)zResult + (long)iStack_3c)] & 0x400) == 0;
      }
      if (!bVar4) break;
      iStack_3c = iStack_3c + 1;
    }
    if (*(char *)((long)zResult + (long)iStack_3c) == '\0') {
      jx9_result_string(pCtx,"?000",4);
    }
    else {
      local_41 = ""[(int)(*(byte *)((long)zResult + (long)iStack_3c) & 0x7f)];
      iVar2 = toupper((uint)*(byte *)((long)zResult + (long)iStack_3c));
      j._0_1_ = (undefined1)iVar2;
      code = 1;
      while( true ) {
        bVar4 = false;
        if (code < 4) {
          bVar4 = *(char *)((long)zResult + (long)iStack_3c) != '\0';
        }
        if (!bVar4) break;
        uVar1 = ""[(int)(*(byte *)((long)zResult + (long)iStack_3c) & 0x7f)];
        if (uVar1 == '\0') {
          local_41 = '\0';
        }
        else if (uVar1 != local_41) {
          *(uchar *)((long)&j + (long)code) = uVar1 + '0';
          local_41 = uVar1;
          code = code + 1;
        }
        iStack_3c = iStack_3c + 1;
      }
      while (code < 4) {
        *(undefined1 *)((long)&j + (long)code) = 0x30;
        code = code + 1;
      }
      jx9_result_string(pCtx,(char *)&j,4);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_soundex(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn;
	char zResult[8];
	int i, j;
	static const unsigned char iCode[] = {
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 1, 2, 3, 0, 1, 2, 0, 0, 2, 2, 4, 5, 5, 0, 
		1, 2, 6, 2, 3, 0, 1, 0, 2, 0, 2, 0, 0, 0, 0, 0, 
		0, 0, 1, 2, 3, 0, 1, 2, 0, 0, 2, 2, 4, 5, 5, 0, 
		1, 2, 6, 2, 3, 0, 1, 0, 2, 0, 2, 0, 0, 0, 0, 0, 
	};
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	zIn = (unsigned char *)jx9_value_to_string(apArg[0], 0);
	for(i=0; zIn[i] && zIn[i] < 0xc0 && !SyisAlpha(zIn[i]); i++){}
	if( zIn[i] ){
		unsigned char prevcode = iCode[zIn[i]&0x7f];
		zResult[0] = (char)SyToUpper(zIn[i]);
		for(j=1; j<4 && zIn[i]; i++){
			int code = iCode[zIn[i]&0x7f];
			if( code>0 ){
				if( code!=prevcode ){
					prevcode = (unsigned char)code;
					zResult[j++] = (char)code + '0';
				}
			}else{
				prevcode = 0;
			}
		}
		while( j<4 ){
			zResult[j++] = '0';
		}
		jx9_result_string(pCtx, zResult, 4);
	}else{
	  jx9_result_string(pCtx, "?000", 4);
	}
	return JX9_OK;
}